

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_deconvolution_mul(NetOptimize *this)

{
  int iVar1;
  uint uVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  Layer *pLVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  pointer piVar12;
  ulong uVar13;
  ulong uVar14;
  int j;
  ulong uVar15;
  size_t i;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong local_38;
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar17 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_38 = 1;
  uVar16 = 0;
  do {
    if (uVar16 == uVar17) {
      return 0;
    }
    bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar16]->type,"Deconvolution"
                            );
    if (!bVar10) {
      iVar1 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar16]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar13 = local_38; uVar13 < uVar17; uVar13 = uVar13 + 1) {
        bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar13]->type,"BinaryOp"
                                );
        if (((!bVar10) &&
            (pLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar13],
            piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar5 == 8)) && (*piVar5 == iVar1)) {
          if (uVar17 != uVar13) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar13];
            if ((*(int *)&pLVar4[1]._vptr_Layer == 2) &&
               (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)) {
              pLVar7 = ppLVar6[uVar16];
              uVar14 = uVar13;
              if (uVar17 < uVar13) {
                uVar14 = uVar17;
              }
              uVar18 = 0;
              while ((uVar15 = uVar14, uVar14 != uVar18 &&
                     ((bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start[uVar18]
                                                 ->type,"MemoryData"), bVar10 ||
                      (uVar15 = uVar18,
                      *((((this->super_ModelWriter).layers)->
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar18]->tops).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start !=
                      *(int *)(*(long *)&(pLVar4->bottoms).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + 4)))))) {
                uVar18 = uVar18 + 1;
              }
              if (uVar15 != uVar13) {
                pLVar8 = (((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar15];
                uVar2 = *(uint *)&pLVar7[1]._vptr_Layer;
                uVar13 = (ulong)uVar2;
                if (((*(uint *)&pLVar8[1]._vptr_Layer == uVar2) &&
                    (*(int *)((long)&pLVar8[1]._vptr_Layer + 4) == 0)) &&
                   (iVar1._0_1_ = pLVar8[1].support_bf16_storage,
                   iVar1._1_1_ = pLVar8[1].support_fp16_storage,
                   iVar1._2_1_ = pLVar8[1].support_int8_storage,
                   iVar1._3_1_ = pLVar8[1].support_image_storage, iVar1 == 0)) {
                  fprintf(_stderr,"fuse_deconvolution_mul %s %s\n",(pLVar7->name)._M_dataplus._M_p,
                          (pLVar4->name)._M_dataplus._M_p);
                  uVar11 = *(int *)&pLVar7[1].type.field_2 / (int)uVar2;
                  piVar12 = *(pointer *)
                             ((long)&pLVar7[1].tops.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl + 8);
                  lVar9 = *(long *)&pLVar7[2].one_blob_only;
                  uVar14 = 0;
                  if (0 < (int)uVar11) {
                    uVar14 = (ulong)uVar11;
                  }
                  if ((int)uVar2 < 1) {
                    uVar13 = 0;
                  }
                  for (uVar18 = 0; uVar18 != uVar13; uVar18 = uVar18 + 1) {
                    for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
                      piVar12[uVar15] =
                           (int)(*(float *)(*(long *)&pLVar8[1].support_tensor_storage + uVar18 * 4)
                                * (float)piVar12[uVar15]);
                    }
                    if (lVar9 != 0) {
                      *(float *)(lVar9 + uVar18 * 4) =
                           *(float *)(lVar9 + uVar18 * 4) *
                           *(float *)(*(long *)&pLVar8[1].support_tensor_storage + uVar18 * 4);
                    }
                    piVar12 = piVar12 + (int)uVar11;
                  }
                  iVar1 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start = iVar1;
                  (((this->super_ModelWriter).blobs)->
                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar1].producer = (int)uVar16;
                  std::__cxx11::string::assign((char *)&pLVar4->type);
                }
              }
            }
          }
          break;
        }
      }
    }
    uVar16 = uVar16 + 1;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolution_mul()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Deconvolution")
            continue;

        // Deconvolution - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Deconvolution - BinaryOp to Deconvolution
        ncnn::Deconvolution* deconvolution = (ncnn::Deconvolution*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 2 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = deconvolution->num_output;

        if (memorydata->w != channels || memorydata->h != 0 || memorydata->c != 0)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_deconvolution_mul %s %s\n", deconvolution->name.c_str(), binaryop->name.c_str());

        {
            const int weight_per_outch = deconvolution->weight_data_size / channels;

            float* weight = deconvolution->weight_data;
            float* bias = deconvolution->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= memorydata->data[i];
                }

                if (bias)
                {
                    bias[i] = bias[i] * memorydata->data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        deconvolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}